

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O0

void write_mods(ang_file *fff,int *values)

{
  size_t sVar1;
  char *src;
  int local_42c;
  char local_428 [4];
  int pointer;
  char buf [1024];
  ulong local_20;
  size_t i;
  int *values_local;
  ang_file *fff_local;
  
  memset(local_428,0,0x400);
  local_42c = 0;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    if (values[local_20] != 0) {
      sVar1 = strlen(local_428);
      if (sVar1 != 0) {
        my_strcat(local_428," | ",0x400);
        local_42c = local_42c + 3;
      }
      my_strcat(local_428,write_mods::obj_mods[local_20],0x400);
      sVar1 = strlen(write_mods::obj_mods[local_20]);
      src = format("[%d]",(ulong)(uint)values[local_20]);
      my_strcat(local_428,src,0x400);
      local_42c = local_42c + (int)sVar1 + 5;
      if (0x3b < local_42c) {
        file_putf(fff,"%s%s\n","values:",local_428);
        my_strcpy(local_428,"",0x400);
        local_42c = 0;
      }
    }
  }
  if (local_42c != 0) {
    file_putf(fff,"%s%s\n","values:",local_428);
  }
  return;
}

Assistant:

void write_mods(ang_file *fff, const int values[])
{
	size_t i;
	char buf[1024] = "";
	int pointer = 0;

	static const char *obj_mods[] = {
		#define STAT(a) #a,
		#include "list-stats.h"
		#undef STAT
		#define OBJ_MOD(a) #a,
		#include "list-object-modifiers.h"
		#undef OBJ_MOD
		NULL
	};

	/* Write value list */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		/* If no value, don't write */
		if (values[i] == 0) continue;

		/* If this line contains something, write a divider */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* Write the name and value */
		my_strcat(buf, obj_mods[i], sizeof(buf));
		pointer += strlen(obj_mods[i]);
		my_strcat(buf, format("[%d]", values[i]), sizeof(buf));
		pointer += 5;

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", "values:", buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining values if any */
	if (pointer)
		file_putf(fff, "%s%s\n", "values:", buf);
}